

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O0

char * __thiscall wabt::Type::GetRefKindName(Type *this)

{
  Type *this_local;
  
  switch(this->enum_) {
  case Array:
    this_local = (Type *)anon_var_dwarf_dfc50;
    break;
  case Struct:
    this_local = (Type *)anon_var_dwarf_de329;
    break;
  default:
    this_local = (Type *)anon_var_dwarf_9d839;
    break;
  case ExnRef:
    this_local = (Type *)anon_var_dwarf_dead3;
    break;
  case ExternRef:
    this_local = (Type *)0x256f46;
    break;
  case FuncRef:
    this_local = (Type *)0x254838;
  }
  return (char *)this_local;
}

Assistant:

const char* GetRefKindName() const {
    switch (enum_) {
      case Type::FuncRef:   return "func";
      case Type::ExternRef: return "extern";
      case Type::ExnRef:    return "exn";
      case Type::Struct:    return "struct";
      case Type::Array:     return "array";
      default:              return "<invalid>";
    }
  }